

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O3

void __thiscall btRigidBody::addConstraintRef(btRigidBody *this,btTypedConstraint *c)

{
  btTypedConstraint **ptr;
  int iVar1;
  ulong uVar2;
  btTypedConstraint **ppbVar3;
  ulong uVar4;
  int iVar5;
  btRigidBody *co;
  btRigidBody *this_00;
  
  iVar1 = (this->m_constraintRefs).m_size;
  uVar2 = (ulong)iVar1;
  if (0 < (long)uVar2) {
    uVar4 = 0;
    do {
      if ((this->m_constraintRefs).m_data[uVar4] == c) {
        if (iVar1 != (int)uVar4) {
          return;
        }
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (iVar1 == (this->m_constraintRefs).m_capacity) {
    iVar5 = 1;
    if (iVar1 != 0) {
      iVar5 = iVar1 * 2;
    }
    if (iVar1 < iVar5) {
      if (iVar5 == 0) {
        ppbVar3 = (btTypedConstraint **)0x0;
      }
      else {
        ppbVar3 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar5 << 3,0x10);
        uVar2 = (ulong)(uint)(this->m_constraintRefs).m_size;
      }
      iVar1 = (int)uVar2;
      if (0 < iVar1) {
        uVar4 = 0;
        do {
          ppbVar3[uVar4] = (this->m_constraintRefs).m_data[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uVar2 & 0xffffffff) != uVar4);
      }
      ptr = (this->m_constraintRefs).m_data;
      if ((ptr != (btTypedConstraint **)0x0) && ((this->m_constraintRefs).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        iVar1 = (this->m_constraintRefs).m_size;
      }
      (this->m_constraintRefs).m_ownsMemory = true;
      (this->m_constraintRefs).m_data = ppbVar3;
      (this->m_constraintRefs).m_capacity = iVar5;
    }
  }
  (this->m_constraintRefs).m_data[iVar1] = c;
  (this->m_constraintRefs).m_size = iVar1 + 1;
  this_00 = c->m_rbA;
  co = c->m_rbB;
  if (this_00 != this) {
    co = this_00;
    this_00 = c->m_rbB;
  }
  btCollisionObject::setIgnoreCollisionCheck
            (&this_00->super_btCollisionObject,&co->super_btCollisionObject,true);
  return;
}

Assistant:

void btRigidBody::addConstraintRef(btTypedConstraint* c)
{
	///disable collision with the 'other' body

	int index = m_constraintRefs.findLinearSearch(c);
	//don't add constraints that are already referenced
	//btAssert(index == m_constraintRefs.size());
	if (index == m_constraintRefs.size())
	{
		m_constraintRefs.push_back(c);
		btCollisionObject* colObjA = &c->getRigidBodyA();
		btCollisionObject* colObjB = &c->getRigidBodyB();
		if (colObjA == this)
		{
			colObjA->setIgnoreCollisionCheck(colObjB, true);
		}
		else
		{
			colObjB->setIgnoreCollisionCheck(colObjA, true);
		}
	} 
}